

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayBase.cpp
# Opt level: O1

void __thiscall amrex::FabArrayBase::RB180::define(RB180 *this,FabArrayBase *fa)

{
  pointer *ppCVar1;
  undefined8 *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  iterator iVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  long lVar10;
  undefined8 uVar11;
  pointer ppVar12;
  long lVar13;
  mapped_type *this_00;
  vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>> *this_01;
  _Rb_tree_node_base *p_Var14;
  int iVar15;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *pmVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  bool bVar23;
  int dst_owner;
  Box bxsnd;
  Box gbx;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  int local_15c;
  ulong local_158;
  int local_150;
  int local_14c;
  uint local_148;
  uint local_144;
  int local_140;
  int local_13c;
  Box local_138;
  Box local_118;
  BoxArray *local_f8;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *local_f0;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> local_e8;
  CopyComTag local_c8;
  ulong local_88;
  int local_7c;
  uint local_78;
  int local_74;
  uint local_70;
  int local_6c;
  uint local_68;
  int local_64;
  FabArrayBase *local_60;
  IntVect *local_58;
  ulong local_50;
  ulong local_48;
  map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
  *local_40;
  long local_38;
  
  iVar19 = *(int *)(ParallelContext::frames + 0xc);
  local_f8 = &fa->boxarray;
  local_158 = (ulong)((long)(fa->indexArray).super_vector<int,_std::allocator<int>_>.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(fa->indexArray).super_vector<int,_std::allocator<int>_>.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2;
  local_e8.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar3 = (this->m_domain).smallend.vect[0];
  iVar4 = (this->m_domain).smallend.vect[1];
  iVar21 = (this->m_domain).bigend.vect[1];
  local_148 = iVar3 - (this->m_ngrow).vect[0];
  local_14c = (this->m_ngrow).vect[1];
  local_150 = iVar4 - local_14c;
  local_14c = local_14c + iVar21;
  iVar5 = (this->m_ngrow).vect[2];
  local_140 = (this->m_domain).smallend.vect[2] - iVar5;
  local_144 = iVar5 + (this->m_domain).bigend.vect[2];
  iVar21 = iVar21 - iVar4;
  if (0 < (int)(uint)local_158) {
    local_58 = &this->m_ngrow;
    local_70 = -iVar3;
    local_74 = iVar21 - local_14c;
    local_78 = ~local_148;
    local_7c = iVar21 - local_150;
    local_40 = (this->super_CommMetaData).m_SndTags._M_t.
               super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
               .
               super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
               ._M_head_impl;
    local_50 = (ulong)((uint)local_158 & 0x7fffffff);
    uVar18 = 0;
    local_13c = iVar19;
    local_60 = fa;
    do {
      local_38 = (long)(fa->indexArray).super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start[uVar18];
      BATransformer::operator()
                (&local_118,&local_f8->m_bat,
                 (Box *)(local_38 * 0x1c +
                        *(long *)&(((fa->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      lVar13 = 0;
      do {
        iVar4 = local_118.smallend.vect[lVar13 + 1];
        if (iVar4 == (this->m_domain).smallend.vect[lVar13 + 1]) {
          local_118.smallend.vect[lVar13 + 1] = iVar4 - (this->m_ngrow).vect[lVar13 + 1];
        }
        iVar4 = local_118.bigend.vect[lVar13 + 1];
        if (iVar4 == (this->m_domain).bigend.vect[lVar13 + 1]) {
          local_118.bigend.vect[lVar13 + 1] = iVar4 + (this->m_ngrow).vect[lVar13 + 1];
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != 2);
      uVar17 = local_118.smallend.vect[0];
      if (local_118.smallend.vect[0] <= (int)local_70) {
        uVar17 = local_70;
      }
      iVar4 = local_118.smallend.vect[1];
      if (local_118.smallend.vect[1] <= local_74) {
        iVar4 = local_74;
      }
      local_138.smallend.vect[2] = local_118.smallend.vect[2];
      if (local_118.smallend.vect[2] <= local_140) {
        local_138.smallend.vect[2] = local_140;
      }
      uVar22 = local_118.bigend.vect[0];
      if ((int)local_78 <= local_118.bigend.vect[0]) {
        uVar22 = local_78;
      }
      iVar5 = local_118.bigend.vect[1];
      if (local_7c <= local_118.bigend.vect[1]) {
        iVar5 = local_7c;
      }
      local_138.bigend.vect[2] = local_118.bigend.vect[2];
      if ((int)local_144 <= local_118.bigend.vect[2]) {
        local_138.bigend.vect[2] = local_144;
      }
      local_138.smallend.vect[0] = ~uVar22;
      local_138.smallend.vect[1] = iVar21 - iVar5;
      local_138.bigend.vect[0] = ~uVar17;
      local_138.bigend.vect[1] = iVar21 - iVar4;
      local_138.btype.itype = 0;
      local_48 = uVar18;
      if (((((int)uVar17 <= (int)uVar22) && (iVar4 <= iVar5)) &&
          (local_138.smallend.vect[2] <= local_138.bigend.vect[2])) && (local_118.btype.itype < 8))
      {
        BoxArray::intersections(local_f8,&local_138,&local_e8,false,local_58);
        uVar17 = (uint)((ulong)((long)local_e8.
                                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_e8.
                                     super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5);
        if (0 < (int)uVar17) {
          pmVar16 = (map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                     *)(ulong)(uVar17 & 0x7fffffff);
          lVar13 = 0x18;
          do {
            ppVar12 = local_e8.
                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar18 = (ulong)*(int *)((long)(&(local_e8.
                                              super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->second +
                                           -1) + lVar13);
            local_15c = *(int *)(*(long *)&(((fa->distributionMap).m_ref.
                                             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->m_pmap).
                                           super_vector<int,_std::allocator<int>_>.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                uVar18 * 4);
            if (local_15c != iVar19) {
              uVar17 = *(uint *)((long)(&((local_e8.
                                           super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->second).
                                         smallend + -1) + lVar13);
              local_6c = *(int *)((long)((local_e8.
                                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->second).
                                        smallend.vect + lVar13 + -8);
              local_64 = *(int *)((long)((local_e8.
                                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->second).
                                        smallend.vect + lVar13 + -0x10);
              uVar22 = *(uint *)((long)(&((local_e8.
                                           super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->second).
                                         smallend + -2) + lVar13);
              iVar19 = *(int *)((long)((local_e8.
                                        super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->second).smallend
                                      .vect + lVar13 + -0x14);
              local_68 = *(uint *)((long)((local_e8.
                                           super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->second).
                                         smallend.vect + lVar13 + -4);
              local_f0 = pmVar16;
              local_88 = uVar18;
              this_00 = std::
                        map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                        ::operator[](local_40,&local_15c);
              puVar2 = (undefined8 *)((long)(ppVar12->second).smallend.vect + lVar13 + -4);
              local_c8.sbox.bigend.vect[1] = iVar21 - iVar19;
              local_c8.sbox.bigend.vect[0] = ~uVar22;
              local_c8.sbox.smallend.vect[1] = iVar21 - local_6c;
              local_c8.sbox.smallend.vect[0] = ~uVar17;
              local_c8.dbox.smallend.vect._0_8_ = *(undefined8 *)((long)puVar2 + -0x14);
              uVar11 = *(undefined8 *)((long)puVar2 + -0xc);
              local_c8.dbox.bigend.vect[1] = (int)((ulong)puVar2[-1] >> 0x20);
              local_c8.dbox.bigend.vect[2] = (int)*puVar2;
              local_c8.dbox.btype.itype = (uint)((ulong)*puVar2 >> 0x20);
              local_c8.dbox.smallend.vect[2] = (int)uVar11;
              local_c8.dbox.bigend.vect[0] = (int)((ulong)uVar11 >> 0x20);
              local_c8.sbox.smallend.vect[2] = local_64;
              local_c8.sbox.btype.itype = 0;
              local_c8.sbox.bigend.vect[2] = local_68;
              local_c8.dstIndex = (int)local_88;
              local_c8.srcIndex = (int)local_38;
              iVar7._M_current =
                   (this_00->
                   super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
              if (iVar7._M_current ==
                  (this_00->
                  super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                ::_M_realloc_insert<amrex::FabArrayBase::CopyComTag>(this_00,iVar7,&local_c8);
                pmVar16 = local_f0;
                fa = local_60;
                iVar19 = local_13c;
              }
              else {
                *(undefined8 *)(((iVar7._M_current)->sbox).bigend.vect + 2) = local_c8.sbox._20_8_;
                (iVar7._M_current)->dstIndex = local_c8.dstIndex;
                (iVar7._M_current)->srcIndex = local_c8.srcIndex;
                *(ulong *)(((iVar7._M_current)->sbox).smallend.vect + 1) =
                     CONCAT44(local_64,local_c8.sbox.smallend.vect[1]);
                *(ulong *)((iVar7._M_current)->sbox).bigend.vect =
                     CONCAT44(local_c8.sbox.bigend.vect[1],local_c8.sbox.bigend.vect[0]);
                *(ulong *)(((iVar7._M_current)->dbox).bigend.vect + 1) =
                     CONCAT44(local_c8.dbox.bigend.vect[2],local_c8.dbox.bigend.vect[1]);
                *(ulong *)&((iVar7._M_current)->dbox).btype =
                     CONCAT44(local_c8.sbox.smallend.vect[0],local_c8.dbox.btype.itype);
                *(undefined8 *)((iVar7._M_current)->dbox).smallend.vect =
                     local_c8.dbox.smallend.vect._0_8_;
                *(undefined8 *)(((iVar7._M_current)->dbox).smallend.vect + 2) = uVar11;
                ppCVar1 = &(this_00->
                           super__Vector_base<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>
                           )._M_impl.super__Vector_impl_data._M_finish;
                *ppCVar1 = *ppCVar1 + 1;
                pmVar16 = local_f0;
                fa = local_60;
                iVar19 = local_13c;
              }
            }
            lVar13 = lVar13 + 0x20;
            pmVar16 = (map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                       *)((long)&pmVar16[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count + 7);
          } while (pmVar16 !=
                   (map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                    *)0x0);
        }
      }
      uVar18 = local_48 + 1;
    } while (uVar18 != local_50);
  }
  if (0 < (int)(uint)local_158) {
    local_f0 = (this->super_CommMetaData).m_RcvTags._M_t.
               super___uniq_ptr_impl<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_std::default_delete<std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_>_>
               .
               super__Head_base<0UL,_std::map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>_*,_false>
               ._M_head_impl;
    local_158 = (ulong)((uint)local_158 & 0x7fffffff);
    uVar18 = 0;
    do {
      iVar4 = (fa->indexArray).super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [uVar18];
      local_88 = uVar18;
      BATransformer::operator()
                (&local_c8.dbox,&local_f8->m_bat,
                 (Box *)((long)iVar4 * 0x1c +
                        *(long *)&(((fa->boxarray).m_ref.
                                    super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->m_abox).
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data));
      iVar5 = (this->m_ngrow).vect[0];
      iVar20 = (this->m_ngrow).vect[1];
      uVar17 = local_c8.dbox.smallend.vect[0] - iVar5;
      iVar15 = local_c8.dbox.smallend.vect[1] - iVar20;
      iVar6 = (this->m_ngrow).vect[2];
      local_118.smallend.vect[2] = local_c8.dbox.smallend.vect[2] - iVar6;
      uVar22 = iVar5 + local_c8.dbox.bigend.vect[0];
      iVar20 = iVar20 + local_c8.dbox.bigend.vect[1];
      local_118.bigend.vect[2] = iVar6 + local_c8.dbox.bigend.vect[2];
      if ((int)uVar17 <= (int)local_148) {
        uVar17 = local_148;
      }
      if (iVar15 <= local_150) {
        iVar15 = local_150;
      }
      if (local_118.smallend.vect[2] <= local_140) {
        local_118.smallend.vect[2] = local_140;
      }
      if ((int)(iVar3 - 1U) <= (int)uVar22) {
        uVar22 = iVar3 - 1U;
      }
      if (local_14c <= iVar20) {
        iVar20 = local_14c;
      }
      if ((int)local_144 <= local_118.bigend.vect[2]) {
        local_118.bigend.vect[2] = local_144;
      }
      local_118.smallend.vect[0] = ~uVar22;
      local_118.smallend.vect[1] = iVar21 - iVar20;
      local_118.bigend.vect[0] = ~uVar17;
      local_118.bigend.vect[1] = iVar21 - iVar15;
      local_118.btype.itype = 0;
      if ((((int)uVar17 <= (int)uVar22) && (iVar15 <= iVar20)) &&
         ((local_118.smallend.vect[2] <= local_118.bigend.vect[2] && (local_c8.dbox.btype.itype < 8)
          ))) {
        BoxArray::intersections(local_f8,&local_118,&local_e8);
        uVar17 = (uint)((ulong)((long)local_e8.
                                      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_e8.
                                     super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 5);
        if (0 < (int)uVar17) {
          uVar18 = 0;
          do {
            local_c8.srcIndex =
                 local_e8.
                 super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar18].first;
            local_138.smallend.vect._0_8_ =
                 *(undefined8 *)
                  local_e8.
                  super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar18].second.smallend.vect;
            uVar11 = *(undefined8 *)
                      (local_e8.
                       super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar18].second.smallend.vect + 2);
            local_138.bigend.vect[1] =
                 (int)((ulong)*(undefined8 *)
                               local_e8.
                               super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar18].second.bigend.vect
                      >> 0x20);
            local_138._20_8_ =
                 *(ulong *)(local_e8.
                            super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar18].second.bigend.vect + 2
                           );
            local_138.smallend.vect[2] = (int)uVar11;
            local_138.bigend.vect[0] = (int)((ulong)uVar11 >> 0x20);
            lVar13 = 0;
            do {
              iVar5 = local_138.smallend.vect[lVar13 + 1];
              if (iVar5 == (this->m_domain).smallend.vect[lVar13 + 1]) {
                local_138.smallend.vect[lVar13 + 1] = iVar5 - (this->m_ngrow).vect[lVar13 + 1];
              }
              iVar5 = local_138.bigend.vect[lVar13 + 1];
              if (iVar5 == (this->m_domain).bigend.vect[lVar13 + 1]) {
                local_138.bigend.vect[lVar13 + 1] = iVar5 + (this->m_ngrow).vect[lVar13 + 1];
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 != 2);
            local_c8.dbox.smallend.vect[0] = ~local_138.bigend.vect[0];
            local_c8.dbox.smallend.vect[1] = iVar21 - local_138.bigend.vect[1];
            local_c8.dbox.bigend.vect[0] = ~local_138.smallend.vect[0];
            local_c8.dbox.bigend.vect[1] = iVar21 - local_138.smallend.vect[1];
            local_15c = *(int *)(*(long *)&(((fa->distributionMap).m_ref.
                                             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr)->m_pmap).
                                           super_vector<int,_std::allocator<int>_>.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                (long)local_c8.srcIndex * 4);
            local_c8.dbox.smallend.vect[2] = local_138.smallend.vect[2];
            local_c8.dbox.bigend.vect[2] = local_138.bigend.vect[2];
            local_c8.dbox.btype.itype = 0;
            local_c8.sbox.bigend.vect[1] = local_138.bigend.vect[1];
            local_c8.sbox.bigend.vect[2] = local_138.bigend.vect[2];
            local_c8.sbox.btype.itype = local_138.btype.itype;
            local_c8.sbox.smallend.vect[2] = local_138.smallend.vect[2];
            local_c8.sbox.bigend.vect[0] = local_138.bigend.vect[0];
            local_c8.sbox.smallend.vect[0] = local_138.smallend.vect[0];
            local_c8.sbox.smallend.vect[1] = local_138.smallend.vect[1];
            local_c8.dstIndex = iVar4;
            if (local_15c == iVar19) {
              this_01 = (vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>
                         *)(this->super_CommMetaData).m_LocTags._M_t.
                           super___uniq_ptr_impl<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_std::default_delete<std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_*,_false>
                           ._M_head_impl;
            }
            else {
              this_01 = (vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>
                         *)std::
                           map<int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<amrex::FabArrayBase::CopyComTag,_std::allocator<amrex::FabArrayBase::CopyComTag>_>_>_>_>
                           ::operator[](local_f0,&local_15c);
            }
            iVar7._M_current = *(CopyComTag **)(this_01 + 8);
            if (iVar7._M_current == *(CopyComTag **)(this_01 + 0x10)) {
              std::
              vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>
              ::_M_realloc_insert<amrex::FabArrayBase::CopyComTag_const&>(this_01,iVar7,&local_c8);
            }
            else {
              *(undefined8 *)(((iVar7._M_current)->sbox).bigend.vect + 2) = local_c8.sbox._20_8_;
              (iVar7._M_current)->dstIndex = local_c8.dstIndex;
              (iVar7._M_current)->srcIndex = local_c8.srcIndex;
              *(ulong *)(((iVar7._M_current)->sbox).smallend.vect + 1) =
                   CONCAT44(local_c8.sbox.smallend.vect[2],local_c8.sbox.smallend.vect[1]);
              *(ulong *)((iVar7._M_current)->sbox).bigend.vect =
                   CONCAT44(local_c8.sbox.bigend.vect[1],local_c8.sbox.bigend.vect[0]);
              *(ulong *)(((iVar7._M_current)->dbox).bigend.vect + 1) =
                   CONCAT44(local_c8.dbox.bigend.vect[2],local_c8.dbox.bigend.vect[1]);
              *(ulong *)&((iVar7._M_current)->dbox).btype =
                   CONCAT44(local_c8.sbox.smallend.vect[0],local_c8.dbox.btype.itype);
              *(undefined8 *)((iVar7._M_current)->dbox).smallend.vect =
                   local_c8.dbox.smallend.vect._0_8_;
              *(ulong *)(((iVar7._M_current)->dbox).smallend.vect + 2) =
                   CONCAT44(local_c8.dbox.bigend.vect[0],local_c8.dbox.smallend.vect[2]);
              *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 0x40;
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 != (uVar17 & 0x7fffffff));
        }
      }
      uVar18 = local_88 + 1;
    } while (uVar18 != local_158);
  }
  iVar19 = 0;
  do {
    lVar13 = *(long *)((this->m_ngrow).vect + (ulong)(iVar19 != 0) * 2 + -4);
    for (p_Var14 = *(_Rb_tree_node_base **)(lVar13 + 0x18);
        p_Var14 != (_Rb_tree_node_base *)(lVar13 + 8);
        p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
      p_Var8 = p_Var14[1]._M_parent;
      p_Var9 = p_Var14[1]._M_left;
      if (p_Var8 != p_Var9) {
        uVar18 = (long)p_Var9 - (long)p_Var8 >> 6;
        lVar10 = 0x3f;
        if (uVar18 != 0) {
          for (; uVar18 >> lVar10 == 0; lVar10 = lVar10 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<amrex::FabArrayBase::CopyComTag*,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (p_Var8,p_Var9,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<amrex::FabArrayBase::CopyComTag*,std::vector<amrex::FabArrayBase::CopyComTag,std::allocator<amrex::FabArrayBase::CopyComTag>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (p_Var8,p_Var9);
      }
    }
    bVar23 = iVar19 == 0;
    iVar19 = iVar19 + 1;
  } while (bVar23);
  if (local_e8.
      super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
FabArrayBase::RB180::define (const FabArrayBase& fa)
{
    const int myproc = ParallelDescriptor::MyProc();
    const BoxArray& ba = fa.boxArray();
    const DistributionMapping& dm = fa.DistributionMap();
    const Vector<int>& imap = fa.IndexArray();

    const int nlocal = imap.size();
    std::vector<std::pair<int,Box> > isects;

    Box domain_dst = amrex::adjCellLo(m_domain, 0, m_ngrow[0]).grow(1, m_ngrow[1]);
#if (AMREX_SPACEDIM == 3)
    domain_dst.grow(2, m_ngrow[2]);
#endif

    auto const convert = NonLocalBC::Rotate180Fn{m_domain.length(1)};

    Box const& domain_src = convert(domain_dst);

    auto& send_tags = *m_SndTags;

    for (int i = 0; i < nlocal; ++i)
    {
        const int ksnd = imap[i];
        Box gbx = ba[ksnd];
        for (int idim = 1; idim < AMREX_SPACEDIM; ++idim) {
            if (gbx.smallEnd(idim) == m_domain.smallEnd(idim)) {
                gbx.growLo(idim, m_ngrow[idim]);
            }
            if (gbx.bigEnd(idim) == m_domain.bigEnd(idim)) {
                gbx.growHi(idim, m_ngrow[idim]);
            }
        }

        Box const& src_box = gbx & domain_src;
        Box const& dst_box = convert(src_box);

        if (src_box.ok()) {
            ba.intersections(dst_box, isects, false, m_ngrow);
            for (int j = 0, M = isects.size(); j < M; ++j) {
                const int krcv = isects[j].first;
                const Box& bxrcv = isects[j].second;
                const int dst_owner = dm[krcv];
                if (dst_owner != myproc) // local copy will be dealt with later
                {
                    Box const& bxsnd = convert(bxrcv);
                    send_tags[dst_owner].push_back(FabArrayBase::CopyComTag(bxrcv, bxsnd,
                                                                            krcv, ksnd));
                }
            }
        }
    }

    auto& recv_tags = *m_RcvTags;

    for (int i = 0; i < nlocal; ++i)
    {
        const int krcv = imap[i];
        Box const& gbx = amrex::grow(ba[krcv],m_ngrow);

        Box const& dst_box = gbx & domain_dst;
        Box const& src_box = convert(dst_box);

        if (dst_box.ok()) {
            ba.intersections(src_box, isects);
            for (int j = 0, M = isects.size(); j < M; ++j) {
                const int ksnd = isects[j].first;
                Box bxsnd = isects[j].second;
                // the ghost cells at lo-y, hi-y, lo-z, and hi-z
                // boundaries are also the source
                for (int idim = 1; idim < AMREX_SPACEDIM; ++idim) {
                    if (bxsnd.smallEnd(idim) == m_domain.smallEnd(idim)) {
                        bxsnd.growLo(idim, m_ngrow[idim]);
                    }
                    if (bxsnd.bigEnd(idim) == m_domain.bigEnd(idim)) {
                        bxsnd.growHi(idim, m_ngrow[idim]);
                    }
                }
                Box const& bxrcv = convert(bxsnd);
                const int src_owner = dm[ksnd];
                FabArrayBase::CopyComTag cct(bxrcv, bxsnd, krcv, ksnd);
                if (src_owner == myproc) {
                    m_LocTags->push_back(cct);
                } else {
                    recv_tags[src_owner].push_back(cct);
                }
            }
        }
    }

    for (int ipass = 0; ipass < 2; ++ipass) // pass 0: send; pass 1: recv
    {
        auto& Tags = (ipass == 0) ? *m_SndTags : *m_RcvTags;
        for (auto& kv : Tags)
        {
            auto& cctv = kv.second;
            // We need to fix the order so that the send and recv processes match.
            std::sort(cctv.begin(), cctv.end());
        }
    }
}